

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRenode.c
# Opt level: O2

Abc_Ntk_t *
Abc_NtkRenode(Abc_Ntk_t *pNtk,int nFaninMax,int nCubeMax,int nFlowIters,int nAreaIters,int fArea,
             int fUseBdds,int fUseSops,int fUseCnfs,int fUseMv,int fVerbose)

{
  int iVar1;
  code *pcVar2;
  Abc_Ntk_t *pAVar3;
  int *__s;
  DdManager **ppDVar4;
  reo_man **pprVar5;
  If_Par_t Pars;
  
  iVar1 = Abc_NtkGetChoiceNum(pNtk);
  if (iVar1 != 0) {
    puts("Performing renoding with choices.");
  }
  __s = &Pars.nGateSize;
  memset(__s,0,0x120);
  iVar1 = (int)__s;
  Pars.DelayTarget = -1.0;
  Pars.Epsilon = 0.005;
  Pars.fPreprocess = 1;
  Pars.fExpRed = 0;
  Pars.fVerbose = fVerbose;
  Pars.fTruth = 1;
  Pars.fUsePerm = 1;
  Pars.nLatchesCo = 0;
  Pars.pLutLib = (If_LibLut_t *)0x0;
  Pars.pTimesArr = (float *)0x0;
  Pars.fUseBdds = fUseBdds;
  Pars.fUseSops = fUseSops;
  Pars.fUseCnfs = fUseCnfs;
  Pars.fUseMv = fUseMv;
  Pars.nLutSize = nFaninMax;
  Pars.nCutsMax = nCubeMax;
  Pars.nFlowIters = nFlowIters;
  Pars.nAreaIters = nAreaIters;
  Pars.fArea = fArea;
  if (fUseBdds == 0) {
    if (fUseSops == 0) {
      if (fUseCnfs == 0) {
        if (fUseMv == 0) {
          pcVar2 = Abc_NtkRenodeEvalAig;
        }
        else {
          pcVar2 = Abc_NtkRenodeEvalMv;
        }
      }
      else {
        Pars.fArea = 1;
        pcVar2 = Abc_NtkRenodeEvalCnf;
      }
    }
    else {
      pcVar2 = Abc_NtkRenodeEvalSop;
    }
    Pars.pFuncCost = pcVar2;
    if (s_vMemory != (Vec_Int_t *)0x0) {
      __assert_fail("s_vMemory == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcRenode.c"
                    ,0x81,
                    "Abc_Ntk_t *Abc_NtkRenode(Abc_Ntk_t *, int, int, int, int, int, int, int, int, int, int)"
                   );
    }
    s_vMemory = Vec_IntAlloc(iVar1);
    s_vMemory2 = Vec_IntAlloc(iVar1);
  }
  else {
    Pars.pFuncCost = Abc_NtkRenodeEvalBdd;
    if (s_pReo != (reo_man *)0x0) {
      __assert_fail("s_pReo == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcRenode.c"
                    ,0x7a,
                    "Abc_Ntk_t *Abc_NtkRenode(Abc_Ntk_t *, int, int, int, int, int, int, int, int, int, int)"
                   );
    }
    s_pDd = Cudd_Init(nFaninMax,0,0x100,0x40000,0);
    s_pReo = Extra_ReorderInit(nFaninMax,100);
    Pars.pReoMan = s_pReo;
  }
  pAVar3 = Abc_NtkIf(pNtk,&Pars);
  if (fUseBdds == 0) {
    Vec_IntFree(s_vMemory);
    Vec_IntFree(s_vMemory2);
    ppDVar4 = (DdManager **)&s_vMemory2;
    pprVar5 = (reo_man **)&s_vMemory;
  }
  else {
    ppDVar4 = &s_pDd;
    Extra_StopManager(s_pDd);
    pprVar5 = &s_pReo;
    Extra_ReorderQuit(s_pReo);
  }
  *pprVar5 = (reo_man *)0x0;
  *ppDVar4 = (DdManager *)0x0;
  return pAVar3;
}

Assistant:

Abc_Ntk_t * Abc_NtkRenode( Abc_Ntk_t * pNtk, int nFaninMax, int nCubeMax, int nFlowIters, int nAreaIters, int fArea, int fUseBdds, int fUseSops, int fUseCnfs, int fUseMv, int fVerbose )
{
    extern Abc_Ntk_t * Abc_NtkIf( Abc_Ntk_t * pNtk, If_Par_t * pPars );
    If_Par_t Pars, * pPars = &Pars;
    Abc_Ntk_t * pNtkNew;

    if ( Abc_NtkGetChoiceNum( pNtk ) )
        printf( "Performing renoding with choices.\n" );

    nDsdCounter = 0;

    // set defaults
    memset( pPars, 0, sizeof(If_Par_t) );
    // user-controlable paramters
    pPars->nLutSize    =  nFaninMax;
    pPars->nCutsMax    =  nCubeMax;
    pPars->nFlowIters  =  nFlowIters;
    pPars->nAreaIters  =  nAreaIters;
    pPars->DelayTarget = -1;
    pPars->Epsilon     =  (float)0.005;
    pPars->fPreprocess =  1;
    pPars->fArea       =  fArea;
    pPars->fFancy      =  0;
    pPars->fExpRed     =  0; //
    pPars->fLatchPaths =  0;
    pPars->fVerbose    =  fVerbose;
    // internal parameters
    pPars->fTruth      =  1;
    pPars->fUsePerm    =  1; 
    pPars->nLatchesCi  =  0;
    pPars->nLatchesCo  =  0;
    pPars->pLutLib     =  NULL; // Abc_FrameReadLibLut();
    pPars->pTimesArr   =  NULL; 
    pPars->pTimesArr   =  NULL;   
    pPars->fUseBdds    =  fUseBdds;
    pPars->fUseSops    =  fUseSops;
    pPars->fUseCnfs    =  fUseCnfs;
    pPars->fUseMv      =  fUseMv;
    if ( fUseBdds )
        pPars->pFuncCost = Abc_NtkRenodeEvalBdd;
    else if ( fUseSops )
        pPars->pFuncCost = Abc_NtkRenodeEvalSop;
    else if ( fUseCnfs )
    {
        pPars->fArea = 1;
        pPars->pFuncCost = Abc_NtkRenodeEvalCnf;
    }
    else if ( fUseMv )
        pPars->pFuncCost = Abc_NtkRenodeEvalMv;
    else
        pPars->pFuncCost = Abc_NtkRenodeEvalAig;

    // start the manager
    if ( fUseBdds )
    {
        assert( s_pReo == NULL );
        s_pDd  = Cudd_Init( nFaninMax, 0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0 );
        s_pReo = Extra_ReorderInit( nFaninMax, 100 );
        pPars->pReoMan  = s_pReo;
    }
    else
    {
        assert( s_vMemory == NULL );
        s_vMemory  = Vec_IntAlloc( 1 << 16 );
        s_vMemory2 = Vec_IntAlloc( 1 << 16 );
    }

    // perform mapping/renoding
    pNtkNew = Abc_NtkIf( pNtk, pPars );

    // start the manager
    if ( fUseBdds )
    {
        Extra_StopManager( s_pDd );
        Extra_ReorderQuit( s_pReo );
        s_pReo = NULL;
        s_pDd  = NULL;
    }
    else
    {
        Vec_IntFree( s_vMemory );
        Vec_IntFree( s_vMemory2 );
        s_vMemory = NULL;
        s_vMemory2 = NULL;
    }

//    printf( "Decomposed %d functions.\n", nDsdCounter );

    return pNtkNew;
}